

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O0

void __thiscall
efsw::DirWatcherGeneric::DirWatcherGeneric
          (DirWatcherGeneric *this,DirWatcherGeneric *parent,WatcherGeneric *ws,string *directory,
          bool recursive,bool reportNewFiles)

{
  bool bVar1;
  reference filename;
  allocator<char> local_229;
  string local_228;
  _Self local_208;
  _List_node_base *local_200;
  _List_iterator<efsw::FileInfo> local_1f8;
  iterator it;
  DirectorySnapshotDiff Diff;
  string local_50;
  byte local_2a;
  byte local_29;
  bool reportNewFiles_local;
  string *psStack_28;
  bool recursive_local;
  string *directory_local;
  WatcherGeneric *ws_local;
  DirWatcherGeneric *parent_local;
  DirWatcherGeneric *this_local;
  
  this->Parent = parent;
  this->Watch = ws;
  local_2a = reportNewFiles;
  local_29 = recursive;
  psStack_28 = directory;
  directory_local = (string *)ws;
  ws_local = (WatcherGeneric *)parent;
  parent_local = this;
  DirectorySnapshot::DirectorySnapshot(&this->DirSnap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
  ::map(&this->Directories);
  this->Recursive = (bool)(local_29 & 1);
  this->Deleted = false;
  std::__cxx11::string::string((string *)&local_50,(string *)psStack_28);
  resetDirectory(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if ((local_2a & 1) == 0) {
    DirectorySnapshot::scan((DirectorySnapshotDiff *)&Diff.DirChanged,&this->DirSnap);
    DirectorySnapshotDiff::~DirectorySnapshotDiff((DirectorySnapshotDiff *)&Diff.DirChanged);
  }
  else {
    DirectorySnapshot::scan((DirectorySnapshotDiff *)&it,&this->DirSnap);
    bVar1 = DirectorySnapshotDiff::changed((DirectorySnapshotDiff *)&it);
    if (bVar1) {
      std::_List_iterator<efsw::FileInfo>::_List_iterator(&local_1f8);
      local_200 = (_List_node_base *)
                  std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                            ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                             &Diff.FilesDeleted.
                              super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
                              _M_impl._M_node._M_size);
      local_1f8._M_node = local_200;
      while( true ) {
        local_208._M_node =
             (_List_node_base *)
             std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                       ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                        &Diff.FilesDeleted.
                         super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                         _M_node._M_size);
        bVar1 = std::operator!=(&local_1f8,&local_208);
        if (!bVar1) break;
        filename = std::_List_iterator<efsw::FileInfo>::operator*(&local_1f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"",&local_229);
        handleAction(this,&filename->Filepath,1,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator(&local_229);
        std::_List_iterator<efsw::FileInfo>::operator++(&local_1f8,0);
      }
    }
    DirectorySnapshotDiff::~DirectorySnapshotDiff((DirectorySnapshotDiff *)&it);
  }
  return;
}

Assistant:

DirWatcherGeneric::DirWatcherGeneric( DirWatcherGeneric * parent, WatcherGeneric * ws, const std::string& directory, bool recursive, bool reportNewFiles ) :
	Parent( parent ),
	Watch( ws ),
	Recursive( recursive ),
	Deleted( false )
{
	resetDirectory( directory );

	if ( !reportNewFiles )
	{
		DirSnap.scan();
	}
	else
	{
		DirectorySnapshotDiff Diff = DirSnap.scan();

		if ( Diff.changed() )
		{
			FileInfoList::iterator it;

			DiffIterator( FilesCreated )
			{
				handleAction( ( *it ).Filepath, Actions::Add );
			}
		}
	}
}